

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.cc
# Opt level: O2

void __thiscall xemmai::t_child::f_wait(t_child *this,int a_options)

{
  __pid_t _Var1;
  int *piVar2;
  int __pid;
  
  __pid = this->v_pid;
  if (__pid != 0) {
    do {
      _Var1 = waitpid(__pid,&this->v_status,a_options);
      __pid = this->v_pid;
      if (_Var1 == __pid) goto LAB_0011cec3;
      if (_Var1 != -1) {
        return;
      }
      piVar2 = __errno_location();
    } while (*piVar2 == 4);
    xemmai::portable::f_throw_system_error();
LAB_0011cec3:
    this->v_pid = 0;
  }
  return;
}

Assistant:

void f_wait(int a_options)
	{
		if (!v_pid) return;
		while (true) {
			auto pid = waitpid(v_pid, &v_status, a_options);
			if (pid == v_pid) break;
			if (pid != -1) return;
			if (errno != EINTR) portable::f_throw_system_error();
		}
		v_pid = 0;
	}